

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<double,_signed_char>::Run
          (DataTransform<double,_signed_char> *this,istream *input_stream)

{
  undefined1 uVar1;
  ulong uVar2;
  istream *in_RSI;
  long in_RDI;
  bool bVar3;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  ostringstream error_message;
  bool is_clipped;
  char output_data;
  invalid_argument *anon_var_0;
  string word;
  double input_data;
  int index;
  char buffer [128];
  ostream *in_stack_fffffffffffffd28;
  allocator *in_stack_fffffffffffffd30;
  ostringstream *in_stack_fffffffffffffd38;
  ostream *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  char in_stack_fffffffffffffd56;
  allocator local_281;
  string local_280 [32];
  ostringstream local_260 [376];
  undefined6 in_stack_ffffffffffffff18;
  undefined1 uVar4;
  string *in_stack_ffffffffffffff20;
  int local_d8;
  string local_c8 [32];
  double local_a8;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar3 = sptk::ReadStream<double>
                        ((double *)in_stack_fffffffffffffd38,(istream *)in_stack_fffffffffffffd30);
      if (!bVar3) goto LAB_0016fe99;
    }
    else {
      std::__cxx11::string::string(local_c8);
      std::operator>>(local_18,local_c8);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffd30,(size_t *)in_stack_fffffffffffffd28)
        ;
        in_stack_fffffffffffffd4c = SUB104(in_ST0,0);
        local_a8 = (double)in_ST0;
        local_d8 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      else {
        local_d8 = 2;
      }
      std::__cxx11::string::~string(local_c8);
      if (local_d8 != 0) {
        if (local_d8 != 1) {
LAB_0016fe99:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
        goto LAB_0016fed5;
      }
      in_stack_fffffffffffffd48 = 0;
    }
    uVar1 = (undefined1)(int)local_a8;
    uVar4 = false;
    if (*(char *)(in_RDI + 0x37) < *(char *)(in_RDI + 0x38)) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        if ((long)local_a8 < (long)*(char *)(in_RDI + 0x37)) {
          uVar1 = *(undefined1 *)(in_RDI + 0x37);
          uVar4 = true;
        }
        else {
          uVar4 = (long)*(char *)(in_RDI + 0x38) < (long)local_a8;
          if ((bool)uVar4) {
            uVar1 = *(undefined1 *)(in_RDI + 0x38);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        if ((ulong)((long)local_a8 |
                   (long)(local_a8 - 9.223372036854776e+18) & (long)local_a8 >> 0x3f) <
            (ulong)(long)*(char *)(in_RDI + 0x37)) {
          uVar1 = *(undefined1 *)(in_RDI + 0x37);
          uVar4 = true;
        }
        else {
          uVar4 = (ulong)(long)*(char *)(in_RDI + 0x38) <
                  (ulong)((long)local_a8 |
                         (long)(local_a8 - 9.223372036854776e+18) & (long)local_a8 >> 0x3f);
          if ((bool)uVar4) {
            uVar1 = *(undefined1 *)(in_RDI + 0x38);
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        in_ST6 = in_ST5;
        in_ST7 = in_ST5;
        if ((double)(short)*(char *)(in_RDI + 0x37) <= local_a8) {
          uVar4 = (double)(short)*(char *)(in_RDI + 0x38) < local_a8;
          if ((bool)uVar4) {
            uVar1 = *(undefined1 *)(in_RDI + 0x38);
          }
        }
        else {
          uVar1 = *(undefined1 *)(in_RDI + 0x37);
          uVar4 = true;
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && ((bool)uVar4 == false)) {
      if (local_a8 <= 0.0) {
        uVar1 = (undefined1)(int)(local_a8 + -0.5);
      }
      else {
        uVar1 = (undefined1)(int)(local_a8 + 0.5);
      }
    }
    if (((bool)uVar4 != false) && (*(int *)(in_RDI + 0x30) != 0)) {
      in_stack_fffffffffffffd38 = local_260;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffffd38);
      in_stack_fffffffffffffd40 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd38,local_9c);
      std::operator<<(in_stack_fffffffffffffd40,"th data is over the range of output type");
      in_stack_fffffffffffffd30 = &local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"x2x",in_stack_fffffffffffffd30);
      sptk::PrintErrorMessage
                (in_stack_ffffffffffffff20,
                 (ostringstream *)CONCAT17(uVar1,CONCAT16(uVar4,in_stack_ffffffffffffff18)));
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      bVar3 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar3) {
        local_1 = 0;
      }
      std::__cxx11::ostringstream::~ostringstream(local_260);
      if (bVar3) goto LAB_0016fed5;
    }
    if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
      bVar3 = sptk::WriteStream<signed_char>
                        ((char)((ulong)in_stack_fffffffffffffd30 >> 0x30),in_stack_fffffffffffffd28)
      ;
      if (!bVar3) {
        local_1 = 0;
LAB_0016fed5:
        return (bool)(local_1 & 1);
      }
    }
    else {
      bVar3 = sptk::SnPrintf<signed_char>
                        (in_stack_fffffffffffffd56,
                         (string *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                         (size_t)in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38);
      if (!bVar3) {
        local_1 = 0;
        goto LAB_0016fed5;
      }
      std::operator<<((ostream *)&std::cout,local_98);
      if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&std::cout,"\t");
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }